

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O2

void __thiscall SCSI::Bus::set_activity_observer(Bus *this,Observer *observer)

{
  allocator<char> local_31;
  string local_30 [32];
  
  this->activity_observer_ = observer;
  std::__cxx11::string::string<std::allocator<char>>(local_30,"SCSI",&local_31);
  (*observer->_vptr_Observer[2])(observer,local_30,0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Bus::set_activity_observer(Activity::Observer *observer) {
	activity_observer_ = observer;
	activity_observer_->register_led("SCSI");
}